

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_gtest_tests::iu_GTestSyntaxTest_x_iutest_x_StrEq_Test::Body
          (iu_GTestSyntaxTest_x_iutest_x_StrEq_Test *this)

{
  bool bVar1;
  Fixed *pFVar2;
  char *pcVar3;
  type **in_stack_fffffffffffff788;
  AssertionHelper local_7d0;
  Fixed local_7a0;
  undefined1 local_618 [8];
  AssertionResult iutest_ar_3;
  char *p_3;
  Fixed local_5b8;
  undefined1 local_430 [8];
  AssertionResult iutest_ar_2;
  char *p_2;
  Fixed local_3d0;
  undefined1 local_248 [8];
  AssertionResult iutest_ar_1;
  char *p_1;
  AssertionHelper local_210;
  Fixed local_1e0;
  undefined1 local_48 [8];
  AssertionResult iutest_ar;
  char *p;
  iu_GTestSyntaxTest_x_iutest_x_StrEq_Test *piStack_10;
  char test [5];
  iu_GTestSyntaxTest_x_iutest_x_StrEq_Test *this_local;
  
  p._3_4_ = 0x74736574;
  p._7_1_ = 0;
  iutest_ar._32_8_ = (long)"GetParam() can only use the value-parameterized test" + 0x30;
  piStack_10 = this;
  iutest::detail::AlwaysZero();
  iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
            ((AssertionResult *)local_48,(internal *)0x55d460,"test",(char *)iutest_ar._32_8_,
             (char *)((long)&p + 3),(char *)&iutest_type_traits::enabler_t<void>::value,
             in_stack_fffffffffffff788);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    memset(&local_1e0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1e0);
    pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_1e0,(char *)iutest_ar._32_8_);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_48);
    iutest::AssertionHelper::AssertionHelper
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
               ,0x163,pcVar3,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_210,pFVar2);
    iutest::AssertionHelper::~AssertionHelper(&local_210);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1e0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (bVar1) {
    iutest_ar_1._32_8_ = (long)"GetParam() can only use the value-parameterized test" + 0x30;
    iutest::detail::AlwaysZero();
    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
              ((AssertionResult *)local_248,(internal *)0x55d460,"test",(char *)iutest_ar_1._32_8_,
               (char *)((long)&p + 3),(char *)&iutest_type_traits::enabler_t<void>::value,
               in_stack_fffffffffffff788);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
    if (!bVar1) {
      memset(&local_3d0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3d0);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_3d0,(char *)iutest_ar_1._32_8_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_248);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&p_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0x165,pcVar3,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&p_2,pFVar2);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&p_2);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3d0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_248);
    iutest_ar_2._32_8_ = (long)"GetParam() can only use the value-parameterized test" + 0x30;
    iutest::detail::AlwaysZero();
    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
              ((AssertionResult *)local_430,(internal *)0x55d460,"test",(char *)iutest_ar_2._32_8_,
               (char *)((long)&p + 3),(char *)&iutest_type_traits::enabler_t<void>::value,
               in_stack_fffffffffffff788);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
    if (!bVar1) {
      memset(&local_5b8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_5b8);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_5b8,(char *)iutest_ar_2._32_8_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_430);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&p_3,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0x167,pcVar3,kWarning);
      iutest::AssertionHelper::operator=((AssertionHelper *)&p_3,pFVar2);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&p_3);
      iutest::AssertionHelper::Fixed::~Fixed(&local_5b8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_430);
    iutest_ar_3._32_8_ = (long)"GetParam() can only use the value-parameterized test" + 0x30;
    iutest::detail::AlwaysZero();
    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
              ((AssertionResult *)local_618,(internal *)0x55d460,"test",(char *)iutest_ar_3._32_8_,
               (char *)((long)&p + 3),(char *)&iutest_type_traits::enabler_t<void>::value,
               in_stack_fffffffffffff788);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_618);
    if (!bVar1) {
      memset(&local_7a0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_7a0);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_7a0,(char *)iutest_ar_3._32_8_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_618);
      iutest::AssertionHelper::AssertionHelper
                (&local_7d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0x169,pcVar3,kAssumeFailure);
      iutest::AssertionHelper::operator=(&local_7d0,pFVar2);
      iutest::AssertionHelper::~AssertionHelper(&local_7d0);
      iutest::AssertionHelper::Fixed::~Fixed(&local_7a0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_618);
  }
  return;
}

Assistant:

TEST(GTestSyntaxTest, StrEq)
{
    const char test[] = "test";
    if( const char* p = "test" )
        ASSERT_STREQ(p, test) << p;
    if( const char* p = "test" )
        EXPECT_STREQ(p, test) << p;
    if( const char* p = "test" )
        INFORM_STREQ(p, test) << p;
    if( const char* p = "test" )
        ASSUME_STREQ(p, test) << p;
}